

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispPrint.cpp
# Opt level: O1

shared_ptr<Form>
buildList(vector<std::shared_ptr<Form>,_std::allocator<std::shared_ptr<Form>_>_> *forms)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  long *in_RSI;
  shared_ptr<Form> sVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[1];
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*in_RSI == _Var2._M_pi) {
    (forms->super__Vector_base<std::shared_ptr<Form>,_std::allocator<std::shared_ptr<Form>_>_>).
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
    _Var1 = gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
    (forms->super__Vector_base<std::shared_ptr<Form>,_std::allocator<std::shared_ptr<Form>_>_>).
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Var1._M_pi)->_M_use_count = (_Var1._M_pi)->_M_use_count + 1;
      }
    }
  }
  else {
    sVar3 = buildList((shared_ptr<Form> *)forms,
                      (int)(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*in_RSI);
    _Var2 = sVar3.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  sVar3.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)forms;
  return (shared_ptr<Form>)sVar3.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Form> buildList(std::vector<std::shared_ptr<Form>>& forms) {
  if(forms.empty()) {
    return gSymbolTable.getEmptyPair();
  }
  return buildList(forms.data(), forms.size());
}